

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

void __thiscall FOptionMenuItemOption::SetSelection(FOptionMenuItemOption *this,int Selection)

{
  FOptionValues *pFVar1;
  Pair *pPVar2;
  FOptionValues **ppFVar3;
  UCVarValue UVar4;
  undefined4 uStack_2c;
  FName local_24;
  
  local_24.Index = *(int *)&(this->super_FOptionMenuItemOptionBase).super_FOptionMenuItem.field_0x24
  ;
  ppFVar3 = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::
            CheckKey(&OptionValues,&local_24);
  if ((((ppFVar3 != (FOptionValues **)0x0) && (pFVar1 = *ppFVar3, pFVar1 != (FOptionValues *)0x0))
      && (this->mCVar != (FBaseCVar *)0x0)) && ((pFVar1->mValues).Count != 0)) {
    pPVar2 = (pFVar1->mValues).Array;
    if (*(int *)((pPVar2->TextValue).Chars + -0xc) == 0) {
      UVar4._4_4_ = uStack_2c;
      UVar4.Float = (float)pPVar2[Selection].Value;
      FBaseCVar::SetGenericRep(this->mCVar,UVar4,CVAR_Float);
    }
    else {
      UVar4.String = FString::LockBuffer(&pPVar2[Selection].TextValue);
      FBaseCVar::SetGenericRep(this->mCVar,UVar4,CVAR_String);
      FString::UnlockBuffer(&((*ppFVar3)->mValues).Array[Selection].TextValue);
    }
  }
  return;
}

Assistant:

void SetSelection(int Selection)
	{
		UCVarValue value;
		FOptionValues **opt = OptionValues.CheckKey(mValues);
		if (opt != NULL && *opt != NULL && mCVar != NULL && (*opt)->mValues.Size() > 0)
		{
			if ((*opt)->mValues[0].TextValue.IsEmpty())
			{
				value.Float = (float)(*opt)->mValues[Selection].Value;
				mCVar->SetGenericRep (value, CVAR_Float);
			}
			else
			{
				value.String = (*opt)->mValues[Selection].TextValue.LockBuffer();
				mCVar->SetGenericRep (value, CVAR_String);
				(*opt)->mValues[Selection].TextValue.UnlockBuffer();
			}
		}
	}